

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall sptk::Matrix::FillDiagonal(Matrix *this,double value)

{
  pointer ppdVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  Fill(this,0.0);
  uVar2 = this->num_row_;
  if (this->num_column_ < this->num_row_) {
    uVar2 = this->num_column_;
  }
  ppdVar1 = (this->index_).super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    ppdVar1[uVar4][uVar4] = value;
  }
  return;
}

Assistant:

void Matrix::FillDiagonal(double value) {
  Fill(0.0);
  const int num_ones(std::min(num_row_, num_column_));
  for (int i(0); i < num_ones; ++i) {
    index_[i][i] = value;
  }
}